

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_addch(wchar_t a,wchar_t c)

{
  int iVar1;
  wchar_t w;
  wchar_t c_local;
  wchar_t a_local;
  
  iVar1 = Term->wid;
  if ((Term->scr->cu & 1U) == 0) {
    if (c == L'\0') {
      c_local = L'\xfffffffe';
    }
    else {
      Term_queue_char(Term,Term->scr->cx,Term->scr->cy,a,c,L'\0',L'\0');
      Term->scr->cx = Term->scr->cx + 1;
      if (Term->scr->cx < iVar1) {
        c_local = L'\0';
      }
      else {
        Term->scr->cu = true;
        c_local = L'\x01';
      }
    }
  }
  else {
    c_local = L'\xffffffff';
  }
  return c_local;
}

Assistant:

errr Term_addch(int a, wchar_t c)
{
	int w = Term->wid;

	/* Handle "unusable" cursor */
	if (Term->scr->cu) return (-1);

	/* Paranoia -- no illegal chars */
	if (!c) return (-2);

	/* Queue the given character for display */
	Term_queue_char(Term, Term->scr->cx, Term->scr->cy, a, c, 0, 0);

	/* Advance the cursor */
	Term->scr->cx++;

	/* Success */
	if (Term->scr->cx < w) return (0);

	/* Note "Useless" cursor */
	Term->scr->cu = 1;

	/* Note "Useless" cursor */
	return (1);
}